

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc.c
# Opt level: O1

void do_aedit(CHAR_DATA *ch,char *argument)

{
  int iVar1;
  DESCRIPTOR_DATA *pDVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  AREA_DATA_conflict **ppAVar6;
  char arg [4608];
  char value2 [4608];
  char acStack_2428 [4608];
  char local_1228 [4608];
  
  bVar3 = check_security(ch);
  if (!bVar3) {
    return;
  }
  ppAVar6 = &ch->in_room->area->next;
  pcVar5 = one_argument(argument,acStack_2428);
  bVar3 = is_number(acStack_2428);
  if (bVar3) {
    iVar4 = atoi(acStack_2428);
    ppAVar6 = &area_first;
    do {
      ppAVar6 = &((AREA_DATA *)ppAVar6)->next->next;
      if ((AREA_DATA *)ppAVar6 == (AREA_DATA *)0x0) {
        ppAVar6 = (AREA_DATA_conflict **)0x0;
        break;
      }
    } while (((AREA_DATA *)ppAVar6)->vnum != iVar4);
    if ((AREA_DATA *)ppAVar6 == (AREA_DATA *)0x0) {
      pcVar5 = "That area vnum does not exist.\n\r";
      goto LAB_0035b282;
    }
  }
  else {
    bVar3 = str_cmp(acStack_2428,"create");
    if (!bVar3) {
      bVar3 = is_npc(ch);
      if ((!bVar3) && (ch->pcdata->security < 9)) {
        pcVar5 = "You do not have the access to create areas.\n\r";
        goto LAB_0035b282;
      }
      one_argument(pcVar5,local_1228);
      iVar4 = atoi(local_1228);
      ppAVar6 = &area_first;
      do {
        ppAVar6 = &((AREA_DATA_conflict *)ppAVar6)->next->next;
        if ((AREA_DATA_conflict *)ppAVar6 == (AREA_DATA_conflict *)0x0) goto LAB_0035b243;
      } while (((AREA_DATA_conflict *)ppAVar6)->vnum != iVar4);
      if ((AREA_DATA_conflict *)ppAVar6 != (AREA_DATA_conflict *)0x0) {
        pcVar5 = "That area already exists!";
        goto LAB_0035b282;
      }
LAB_0035b243:
      ppAVar6 = &new_area()->next;
      area_last->next = (AREA_DATA_conflict *)ppAVar6;
      area_last = (AREA_DATA_conflict *)ppAVar6;
      *(byte *)((AREA_DATA *)ppAVar6)->area_flags =
           (byte)((AREA_DATA *)ppAVar6)->area_flags[0] | 0x10;
      send_to_char("Area created.\n\r",ch);
    }
  }
  bVar3 = is_switched(ch);
  if (!bVar3) {
    iVar4 = ch->pcdata->security;
    iVar1 = ((AREA_DATA *)ppAVar6)->security;
    if ((((iVar1 < iVar4) ||
         (pcVar5 = strstr(((AREA_DATA *)ppAVar6)->builders,ch->name), iVar1 < iVar4)) ||
        (pcVar5 != (char *)0x0)) ||
       (pcVar5 = strstr(((AREA_DATA *)ppAVar6)->builders,"All"), pcVar5 != (char *)0x0)) {
      pDVar2 = ch->desc;
      pDVar2->pEdit = ppAVar6;
      pDVar2->editor = 1;
      aedit_show(ch,"");
      return;
    }
  }
  pcVar5 = "You have insufficent security to edit that area.\n\r";
LAB_0035b282:
  send_to_char(pcVar5,ch);
  return;
}

Assistant:

void do_aedit(CHAR_DATA *ch, char *argument)
{
	AREA_DATA *pArea;
	int value;
	char value2[MAX_STRING_LENGTH];
	char arg[MAX_STRING_LENGTH];

	if (!check_security(ch))
		return;

	pArea = ch->in_room->area;

	argument = one_argument(argument, arg);

	if (is_number(arg))
	{
		value = atoi(arg);
		if (!(pArea = get_area_data(value)))
		{
			send_to_char("That area vnum does not exist.\n\r", ch);
			return;
		}
	}
	else
	{
		if (!str_cmp(arg, "create"))
		{
			if (!is_npc(ch) && (ch->pcdata->security < 9))
			{
				send_to_char("You do not have the access to create areas.\n\r", ch);
				return;
			}

			argument = one_argument(argument, value2);
			value = atoi(value2);

			if (get_area_data(value) != nullptr)
			{
				send_to_char("That area already exists!", ch);
				return;
			}

			pArea = new_area();
			area_last->next = pArea;
			area_last = pArea; /* Thanks, Walker. */

			SET_BIT(pArea->area_flags, AREA_ADDED);

			send_to_char("Area created.\n\r", ch);
		}
	}

	if (!IS_BUILDER(ch, pArea))
	{
		send_to_char("You have insufficent security to edit that area.\n\r", ch);
		return;
	}

	ch->desc->pEdit = (void *)pArea;
	ch->desc->editor = ED_AREA;

	aedit_show(ch, "");
}